

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rect-selection.cpp
# Opt level: O0

void __thiscall pal::RectHandle::setPosition(RectHandle *this,double p)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  double dVar4;
  double local_18;
  double p_local;
  RectHandle *this_local;
  
  local_18 = p;
  p_local = (double)this;
  pdVar3 = qBound<double>(&this->m_min_pos,&local_18,&this->m_max_pos);
  dVar1 = *pdVar3;
  local_18 = dVar1;
  dVar4 = position(this);
  bVar2 = qFuzzyCompare(dVar1,dVar4);
  dVar1 = local_18;
  if (!bVar2) {
    if (this->m_orientation == Horizontal) {
      dVar4 = position(this);
      QGraphicsItem::moveBy((QGraphicsItem *)&this->super_QGraphicsRectItem,0.0,dVar1 - dVar4);
    }
    else {
      dVar4 = position(this);
      QGraphicsItem::moveBy((QGraphicsItem *)&this->super_QGraphicsRectItem,dVar1 - dVar4,0.0);
    }
    moved(this,local_18);
  }
  return;
}

Assistant:

void RectHandle::setPosition(double p) {
    p = qBound(m_min_pos, p, m_max_pos);
    if (qFuzzyCompare(p, position()))
        return;

    if (m_orientation == Qt::Horizontal)
        moveBy(0, p - position());
    else
        moveBy(p - position(), 0);

    emit moved(p);
}